

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorBlock.cpp
# Opt level: O2

Color32 __thiscall nv::ColorBlock::averageColor(ColorBlock *this)

{
  Color32 CVar1;
  char cVar2;
  short sVar6;
  ushort uVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  undefined1 auVar14 [13];
  uint i;
  long lVar15;
  undefined4 *in_RDI;
  short sVar16;
  uint uVar17;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined1 auVar20 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar18;
  undefined6 uVar19;
  
  uVar17 = 0;
  uVar21 = 0;
  uVar22 = 0;
  uVar23 = 0;
  for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
    CVar1.field_0 =
         (anon_union_4_2_12391d8d_for_Color32_0)
         *(anon_union_4_2_12391d8d_for_Color32_0 *)&this->m_color[lVar15].field_0.field_0;
    uVar13 = (ulong)CVar1.field_0._0_2_ & 0xffffffffffff00ff;
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar13;
    auVar10[0xc] = CVar1.field_0._3_1_;
    auVar11[8] = CVar1.field_0._2_1_;
    auVar11._0_8_ = uVar13;
    auVar11[9] = 0;
    auVar11._10_3_ = auVar10._10_3_;
    auVar14._5_8_ = 0;
    auVar14._0_5_ = auVar11._8_5_;
    auVar12[4] = CVar1.field_0._1_1_;
    auVar12._0_4_ = (int)uVar13;
    auVar12[5] = 0;
    auVar12._6_7_ = SUB137(auVar14 << 0x40,6);
    uVar17 = uVar17 + (int)uVar13;
    uVar21 = uVar21 + auVar12._4_4_;
    uVar22 = uVar22 + auVar11._8_4_;
    uVar23 = uVar23 + (uint3)(auVar10._10_3_ >> 0x10);
  }
  auVar20._0_4_ = uVar17 >> 4;
  auVar20._4_4_ = uVar21 >> 4;
  auVar20._8_4_ = uVar22 >> 4;
  auVar20._12_4_ = uVar23 >> 4;
  auVar20 = auVar20 & _DAT_001d73a0;
  sVar6 = auVar20._0_2_;
  cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar20[0] - (0xff < sVar6);
  uVar7 = auVar20._2_2_;
  sVar16 = CONCAT11((uVar7 != 0) * (uVar7 < 0x100) * auVar20[2] - (0xff < uVar7),cVar2);
  sVar6 = auVar20._4_2_;
  cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar20[4] - (0xff < sVar6);
  uVar7 = auVar20._6_2_;
  uVar18 = CONCAT13((uVar7 != 0) * (uVar7 < 0x100) * auVar20[6] - (0xff < uVar7),
                    CONCAT12(cVar3,sVar16));
  sVar6 = auVar20._8_2_;
  cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar20[8] - (0xff < sVar6);
  sVar6 = auVar20._10_2_;
  uVar19 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar20[10] - (0xff < sVar6),
                    CONCAT14(cVar4,uVar18));
  sVar6 = auVar20._12_2_;
  cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar20[0xc] - (0xff < sVar6);
  sVar9 = auVar20._14_2_;
  sVar6 = (short)((uint)uVar18 >> 0x10);
  sVar8 = (short)((uint6)uVar19 >> 0x20);
  sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar20[0xe] - (0xff < sVar9),
                           CONCAT16(cVar5,uVar19)) >> 0x30);
  *in_RDI = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar5 - (0xff < sVar9),
                     CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar4 - (0xff < sVar8),
                              CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                       (0 < sVar16) * (sVar16 < 0x100) * cVar2 - (0xff < sVar16))));
  return (Color32)SUB84(in_RDI,0);
}

Assistant:

Color32 ColorBlock::averageColor() const
{
	uint r, g, b, a;
	r = g = b = a = 0;

	for(uint i = 0; i < 16; i++) {
		r += m_color[i].r;
		g += m_color[i].g;
		b += m_color[i].b;
		a += m_color[i].a;
	}
	
	return Color32(uint8(r / 16), uint8(g / 16), uint8(b / 16), uint8(a / 16));
}